

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O2

bool google::ParseSubstitution(State *state)

{
  char *pcVar1;
  char cVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  undefined4 uVar8;
  undefined2 uVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  bool bVar12;
  char *pcVar13;
  long lVar14;
  long lVar15;
  undefined8 *puVar16;
  State copy;
  
  bVar12 = ParseTwoCharToken(state,"S_");
  if (bVar12) {
LAB_0011ec42:
    MaybeAppend(state,"?");
LAB_0011ec51:
    bVar12 = true;
  }
  else {
    pcVar3 = state->mangled_cur;
    pcVar4 = state->out_cur;
    pcVar5 = state->out_begin;
    pcVar6 = state->out_end;
    pcVar7 = state->prev_name;
    uVar8 = state->prev_name_length;
    uVar9 = state->nest_level;
    uVar10 = state->append;
    uVar11 = state->overflowed;
    pcVar13 = state->mangled_cur;
    if (*pcVar13 == 'S') {
      pcVar1 = pcVar13 + 1;
      state->mangled_cur = pcVar1;
      lVar15 = 0;
      lVar14 = 0;
      while ((cVar2 = pcVar1[lVar15], cVar2 != '\0' &&
             ((byte)(cVar2 - 0x30U) < 10 || (byte)(cVar2 + 0xbfU) < 0x1a))) {
        lVar14 = lVar14 + -1;
        lVar15 = lVar15 + 1;
      }
      if ((lVar14 != 0) && (state->mangled_cur = pcVar1 + -lVar14, pcVar1[lVar15] == '_')) {
        state->mangled_cur = pcVar13 + (2 - lVar14);
        goto LAB_0011ec42;
      }
    }
    state->mangled_cur = pcVar3;
    state->out_cur = pcVar4;
    state->prev_name = pcVar7;
    state->prev_name_length = uVar8;
    state->nest_level = uVar9;
    state->append = (bool)uVar10;
    state->overflowed = (bool)uVar11;
    state->out_begin = pcVar5;
    state->out_end = pcVar6;
    if (*state->mangled_cur == 'S') {
      pcVar13 = state->mangled_cur + 1;
      state->mangled_cur = pcVar13;
      for (puVar16 = (undefined8 *)&DAT_00136868; puVar16[-1] != 0; puVar16 = puVar16 + 2) {
        if (*pcVar13 == *(char *)(puVar16[-1] + 1)) {
          MaybeAppend(state,"std");
          pcVar13 = (char *)*puVar16;
          if (*pcVar13 != '\0') {
            MaybeAppend(state,"::");
            MaybeAppend(state,pcVar13);
          }
          state->mangled_cur = state->mangled_cur + 1;
          goto LAB_0011ec51;
        }
      }
    }
    state->prev_name = pcVar7;
    state->prev_name_length = uVar8;
    state->nest_level = uVar9;
    state->append = (bool)uVar10;
    state->overflowed = (bool)uVar11;
    state->out_begin = pcVar5;
    state->out_end = pcVar6;
    state->mangled_cur = pcVar3;
    state->out_cur = pcVar4;
    bVar12 = false;
  }
  return bVar12;
}

Assistant:

static bool ParseSubstitution(State *state) {
  if (ParseTwoCharToken(state, "S_")) {
    MaybeAppend(state, "?");  // We don't support substitutions.
    return true;
  }

  State copy = *state;
  if (ParseOneCharToken(state, 'S') && ParseSeqId(state) &&
      ParseOneCharToken(state, '_')) {
    MaybeAppend(state, "?");  // We don't support substitutions.
    return true;
  }
  *state = copy;

  // Expand abbreviations like "St" => "std".
  if (ParseOneCharToken(state, 'S')) {
    const AbbrevPair *p;
    for (p = kSubstitutionList; p->abbrev != NULL; ++p) {
      if (state->mangled_cur[0] == p->abbrev[1]) {
        MaybeAppend(state, "std");
        if (p->real_name[0] != '\0') {
          MaybeAppend(state, "::");
          MaybeAppend(state, p->real_name);
        }
        ++state->mangled_cur;
        return true;
      }
    }
  }
  *state = copy;
  return false;
}